

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmain.cpp
# Opt level: O2

void create_netconfig(CVmMainClientIfc *clientifc,TadsNetConfig **netconfig,char **argv)

{
  TadsNetConfig *pTVar1;
  FILE *__stream;
  char *pcVar2;
  char confname [4096];
  char confpath [4096];
  
  if (*netconfig != (TadsNetConfig *)0x0) {
    return;
  }
  pTVar1 = (TadsNetConfig *)operator_new(0x10);
  pTVar1->first_var = (TadsNetConfigVar *)0x0;
  pTVar1->last_var = (TadsNetConfigVar *)0x0;
  *netconfig = pTVar1;
  os_get_special_path(confpath,0x1000,*argv,6);
  pcVar2 = "tadsweb.config";
  os_build_full_path(confname,0x1000,confpath,"tadsweb.config");
  __stream = fopen(confname,"rb");
  if (__stream == (FILE *)0x0) {
    pcVar2 = t3sprintf_alloc("Warning: -webhost mode specified, but couldn\'t read web configuration file \"%s\""
                             ,confname);
    (*clientifc->_vptr_CVmMainClientIfc[10])(clientifc,0,0,pcVar2,0);
    free(pcVar2);
  }
  else {
    TadsNetConfig::read(*netconfig,(int)__stream,clientifc,(size_t)pcVar2);
    fclose(__stream);
  }
  return;
}

Assistant:

static void create_netconfig(
    CVmMainClientIfc *clientifc, TadsNetConfig *&netconfig, char **argv)
{
    if (netconfig == 0)
    {
        /* create the object */
        netconfig = new TadsNetConfig();

        /* build the path to the web config file */
        char confname[OSFNMAX], confpath[OSFNMAX];
        os_get_special_path(confpath, sizeof(confpath), argv[0],
                            OS_GSP_T3_SYSCONFIG);
        os_build_full_path(confname, sizeof(confname),
                           confpath, "tadsweb.config");
        
        /* if there's a net configuration file, read it */
        osfildef *fp = osfoprb(confname, OSFTTEXT);
        if (fp != 0)
        {
            /* read the file into the configuration object */
            netconfig->read(fp, clientifc);
            
            /* done with the file */
            osfcls(fp);
        }
        else
        {
            /* warn that the file is missing */
            char *msg = t3sprintf_alloc(
                "Warning: -webhost mode specified, but couldn't "
                "read web configuration file \"%s\"", confname);
            clientifc->display_error(0, 0, msg, FALSE);
            t3free(msg);
        }
    }
}